

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSkipBytes.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionSkipBytes::write_cpp
          (InstructionSkipBytes *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  StreamSep *pSVar5;
  char *pcVar6;
  uint cont_label;
  allocator local_6e1;
  StreamSep local_6e0;
  string local_698;
  string v;
  string local_658;
  string local_638;
  StreamSep local_618;
  StreamSep local_5d0;
  StreamSep local_588;
  StreamSep local_540;
  StreamSep local_4f8;
  StreamSep local_4b0;
  StreamSep local_468;
  StreamSep local_420;
  StreamSep local_3d8;
  StreamSep local_390;
  StreamSep local_348;
  StreamSep local_300;
  StreamSep local_2b8;
  StreamSep local_270;
  StreamSep local_228;
  StreamSep local_1e0;
  StreamSep local_198;
  StreamSep local_150;
  StreamSep local_108;
  StreamSep local_c0;
  StreamSep local_78;
  
  bVar1 = CppEmitter::need_buf(cpp_emitter);
  if (!bVar1) {
    if (cpp_emitter->buffer_type == 3) {
      if (this->beg == true) {
        StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [6])"if ( ");
        pSVar5 = StreamSep::operator<<(&local_6e0,&this->var);
        StreamSep::operator<<(pSVar5,(char (*) [5])0x177406);
        StreamSep::~StreamSep(&local_6e0);
        std::__cxx11::string::append((char *)&ss->beg);
      }
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [19])"for( size_t n = ( ");
      pSVar5 = StreamSep::operator<<(&local_6e0,&this->var);
      pcVar6 = " )";
      if (this->beg != false) {
        pcVar6 = " ) - 1";
      }
      v._M_dataplus._M_p = pcVar6;
      pSVar5 = StreamSep::operator<<(pSVar5,(char **)&v);
      StreamSep::operator<<(pSVar5,(char (*) [16])"; n--; ++data )");
      StreamSep::~StreamSep(&local_6e0);
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [19])"    if ( *data == ");
      pSVar5 = StreamSep::operator<<(&local_6e0,&cpp_emitter->stop_char);
      StreamSep::operator<<(pSVar5,(char (*) [3])0x179439);
      StreamSep::~StreamSep(&local_6e0);
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [16])0x177f2c);
      iVar3 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      v._M_dataplus._M_p._0_4_ = iVar3;
      pSVar5 = StreamSep::operator<<(&local_6e0,(int *)&v);
      StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
      StreamSep::~StreamSep(&local_6e0);
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [15])0x178279);
      pSVar5 = StreamSep::operator<<(&local_6e0,&cpp_emitter->stop_char);
      StreamSep::operator<<(pSVar5,(char (*) [3])0x179439);
      StreamSep::~StreamSep(&local_6e0);
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [12])0x177f30);
      iVar3 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      v._M_dataplus._M_p._0_4_ = iVar3;
      pSVar5 = StreamSep::operator<<(&local_6e0,(int *)&v);
      StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
      StreamSep::~StreamSep(&local_6e0);
      if (this->beg != true) goto LAB_0015b39b;
      std::__cxx11::string::resize((ulong)&ss->beg);
      pSVar5 = &local_108;
      StreamSepMaker::operator<<(pSVar5,ss,(char (*) [2])0x178092);
    }
    else {
      if (1 < (ulong)(((long)(this->super_Instruction).next.
                             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
        StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [15])"if ( data + ( ");
        pSVar5 = StreamSep::operator<<(&local_6e0,&this->var);
        pcVar6 = " )";
        if (this->beg != false) {
          pcVar6 = " ) - 1";
        }
        v._M_dataplus._M_p = pcVar6;
        pSVar5 = StreamSep::operator<<(pSVar5,(char **)&v);
        pSVar5 = StreamSep::operator<<(pSVar5,(char (*) [20])" > end_m1 ) goto l_");
        local_698._M_dataplus._M_p._0_4_ =
             Instruction::get_id_gen
                       ((this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
        pSVar5 = StreamSep::operator<<(pSVar5,(int *)&local_698);
        StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
        StreamSep::~StreamSep(&local_6e0);
      }
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [11])"data += ( ");
      pSVar5 = StreamSep::operator<<(&local_6e0,&this->var);
      pcVar6 = " )";
      if (this->beg != false) {
        pcVar6 = " ) - 1";
      }
      v._M_dataplus._M_p = pcVar6;
      pSVar5 = StreamSep::operator<<(pSVar5,(char **)&v);
      StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
      pSVar5 = &local_6e0;
    }
    StreamSep::~StreamSep(pSVar5);
    goto LAB_0015b39b;
  }
  cont_label = cpp_emitter->nb_cont_label + 1;
  cpp_emitter->nb_cont_label = cont_label;
  std::__cxx11::string::string((string *)&v,(string *)&this->var);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
          ::count(&cpp_emitter->variables,&v);
  if (sVar4 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6e0,
                   "HPIPE_DATA.",&v);
    std::__cxx11::string::operator=((string *)&v,(string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
  }
  if (this->beg == true) {
    StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [6])"if ( ");
    pSVar5 = StreamSep::operator<<(&local_6e0,&v);
    StreamSep::operator<<(pSVar5,(char (*) [5])0x177406);
    StreamSep::~StreamSep(&local_6e0);
    std::__cxx11::string::append((char *)&ss->beg);
    StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [14])"size_t __l = ");
    pSVar5 = StreamSep::operator<<(&local_6e0,&v);
    StreamSep::operator<<(pSVar5,(char (*) [6])0x178245);
    StreamSep::~StreamSep(&local_6e0);
    std::__cxx11::string::assign((char *)&v);
  }
  StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [13])"if ( data + ");
  pSVar5 = StreamSep::operator<<(&local_6e0,&v);
  StreamSep::operator<<(pSVar5,(char (*) [15])" <= end_m1 ) {");
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [13])"    data += ");
  pSVar5 = StreamSep::operator<<(&local_6e0,&v);
  StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<(&local_150,ss,(char (*) [9])"} else {");
  StreamSep::~StreamSep(&local_150);
  Vec<std::__cxx11::string>::push_back_unique<char_const(&)[73]>
            ((Vec<std::__cxx11::string> *)&cpp_emitter->preliminaries,
             (char (*) [73])
             "#ifndef HPIPE_SIZE_T\n#define HPIPE_SIZE_T size_t\n#endif // HPIPE_SIZE_T\n");
  std::__cxx11::string::string((string *)&local_6e0,"__bytes_to_skip",(allocator *)&local_638);
  std::__cxx11::string::string((string *)&local_698,"HPIPE_SIZE_T",&local_6e1);
  local_658._M_string_length = 0;
  local_658.field_2._M_local_buf[0] = '\0';
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  CppEmitter::add_variable(cpp_emitter,(string *)&local_6e0,&local_698,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_6e0);
  if ((this->beg == true) &&
     (1 < (ulong)(((long)(this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x28))) {
    StreamSepMaker::operator<<(&local_6e0,es,(char (*) [21])"if ( ! buf ) goto l_");
    local_698._M_dataplus._M_p._0_4_ =
         Instruction::get_id_gen
                   ((this->super_Instruction).next.
                    super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    pSVar5 = StreamSep::operator<<(&local_6e0,(int *)&local_698);
    StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
    StreamSep::~StreamSep(&local_6e0);
  }
  StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [34])"    HPIPE_DATA.__bytes_to_skip = ");
  pSVar5 = StreamSep::operator<<(&local_6e0,&v);
  StreamSep::operator<<(pSVar5,(char (*) [37])" - ( buf->data + buf->used - data );");
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [5])"  t_");
  pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
  StreamSep::operator<<(pSVar5,(char (*) [2])0x1776d7);
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<(&local_198,ss,(char (*) [25])"    if ( ! buf->next ) {");
  StreamSep::~StreamSep(&local_198);
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    StreamSepMaker::operator<<(&local_1e0,ss,(char (*) [24])"        if ( last_buf )");
    StreamSep::~StreamSep(&local_1e0);
    StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [20])"            goto l_");
    local_698._M_dataplus._M_p._0_4_ =
         Instruction::get_id_gen
                   ((this->super_Instruction).next.
                    super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    pSVar5 = StreamSep::operator<<(&local_6e0,(int *)&local_698);
    StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
    StreamSep::~StreamSep(&local_6e0);
    uVar2 = Instruction::need_buf_next(&this->super_Instruction);
    if (uVar2 == 0) {
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [35])"        HPIPE_DATA.inp_cont = &&c_");
      pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
      StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
    }
    else {
      std::__cxx11::string::string((string *)&local_6e0,"pending_buf",(allocator *)&local_638);
      std::__cxx11::string::string((string *)&local_698,"HPIPE_BUFF_T *",&local_6e1);
      local_658._M_string_length = 0;
      local_658.field_2._M_local_buf[0] = '\0';
      local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
      CppEmitter::add_variable(cpp_emitter,(string *)&local_6e0,&local_698,&local_658);
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::string::~string((string *)&local_6e0);
      StreamSepMaker::operator<<
                (&local_228,ss,(char (*) [38])"        HPIPE_DATA.pending_buf = buf;");
      StreamSep::~StreamSep(&local_228);
      if (cpp_emitter->buffer_type == 1) {
        uVar2 = Instruction::need_buf_next(&this->super_Instruction);
        if (uVar2 == 1) {
          StreamSepMaker::operator<<
                    (&local_270,ss,(char (*) [38])"        HPIPE_BUFF_T__INC_REF( buf );");
          pSVar5 = &local_270;
        }
        else {
          StreamSepMaker::operator<<
                    (&local_6e0,ss,(char (*) [39])"        HPIPE_BUFF_T__INC_REF_N( buf, ");
          local_698._M_dataplus._M_p._0_4_ = Instruction::need_buf_next(&this->super_Instruction);
          pSVar5 = StreamSep::operator<<(&local_6e0,(uint *)&local_698);
          StreamSep::operator<<(pSVar5,(char (*) [4])0x1775c1);
          pSVar5 = &local_6e0;
        }
        StreamSep::~StreamSep(pSVar5);
      }
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [35])"        HPIPE_DATA.inp_cont = &&e_");
      pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
      StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
    }
    StreamSep::~StreamSep(&local_6e0);
    StreamSepMaker::operator<<(&local_2b8,ss,(char (*) [25])"        return RET_CONT;");
    StreamSep::~StreamSep(&local_2b8);
    uVar2 = Instruction::need_buf_next(&this->super_Instruction);
    if (uVar2 != 0) {
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [9])"      e_");
      pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
      pSVar5 = StreamSep::operator<<(pSVar5,(char (*) [2])0x1776d7);
      bVar1 = cpp_emitter->trace_labels;
      if (bVar1 == true) {
        to_string<unsigned_int>(&local_638,&cont_label);
        std::operator+(&local_658," std::cout << \"e_",&local_638);
        std::operator+(&local_698,&local_658," \" << __LINE__ << std::endl;");
      }
      else {
        std::__cxx11::string::string((string *)&local_698,"",(allocator *)&local_658);
      }
      StreamSep::operator<<(pSVar5,&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      if (bVar1 != false) {
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_638);
      }
      StreamSep::~StreamSep(&local_6e0);
      StreamSepMaker::operator<<
                (&local_300,ss,(char (*) [44])"        HPIPE_DATA.pending_buf->next = buf;");
      StreamSep::~StreamSep(&local_300);
      StreamSepMaker::operator<<
                (&local_348,ss,(char (*) [38])"        HPIPE_DATA.pending_buf = buf;");
      StreamSep::~StreamSep(&local_348);
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [16])"        goto c_");
      pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
      StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
      goto LAB_0015b0e7;
    }
  }
  else {
    StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [16])0x177f2c);
    local_698._M_dataplus._M_p._0_4_ =
         Instruction::get_id_gen
                   ((this->super_Instruction).next.
                    super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    pSVar5 = StreamSep::operator<<(&local_6e0,(int *)&local_698);
    StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
LAB_0015b0e7:
    StreamSep::~StreamSep(&local_6e0);
  }
  StreamSepMaker::operator<<(&local_390,ss,(char (*) [6])"    }");
  StreamSep::~StreamSep(&local_390);
  if (cpp_emitter->buffer_type == 0) {
    StreamSepMaker::operator<<
              (&local_3d8,ss,(char (*) [39])"    end -= buf->used; buf = buf->next;");
    pSVar5 = &local_3d8;
  }
  else {
    uVar2 = Instruction::need_buf_next(&this->super_Instruction);
    if (uVar2 < 2) {
      uVar2 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar2 == 1) {
        StreamSepMaker::operator<<(&local_420,ss,(char (*) [21])"    buf = buf->next;");
        pSVar5 = &local_420;
      }
      else {
        StreamSepMaker::operator<<
                  (&local_468,ss,
                   (char (*) [76])
                   "    HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old );");
        pSVar5 = &local_468;
      }
    }
    else {
      StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [35])0x177f98);
      local_698._M_dataplus._M_p._0_4_ = Instruction::need_buf_next(&this->super_Instruction);
      local_698._M_dataplus._M_p._0_4_ = (uint)local_698._M_dataplus._M_p - 1;
      pSVar5 = StreamSep::operator<<(&local_6e0,(uint *)&local_698);
      StreamSep::operator<<(pSVar5,(char (*) [21])" ); buf = buf->next;");
      pSVar5 = &local_6e0;
    }
  }
  StreamSep::~StreamSep(pSVar5);
  StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [5])"  c_");
  pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
  StreamSep::operator<<(pSVar5,(char (*) [2])0x1776d7);
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<
            (&local_4b0,ss,(char (*) [53])"    if ( HPIPE_DATA.__bytes_to_skip >= buf->used ) {");
  StreamSep::~StreamSep(&local_4b0);
  StreamSepMaker::operator<<
            (&local_4f8,ss,(char (*) [49])"        HPIPE_DATA.__bytes_to_skip -= buf->used;");
  StreamSep::~StreamSep(&local_4f8);
  StreamSepMaker::operator<<(&local_6e0,ss,(char (*) [16])"        goto t_");
  pSVar5 = StreamSep::operator<<(&local_6e0,&cont_label);
  StreamSep::operator<<(pSVar5,(char (*) [2])0x1775c3);
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<(&local_540,ss,(char (*) [6])"    }");
  StreamSep::~StreamSep(&local_540);
  StreamSepMaker::operator<<
            (&local_588,ss,(char (*) [51])"    data = buf->data + HPIPE_DATA.__bytes_to_skip;");
  StreamSep::~StreamSep(&local_588);
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    pSVar5 = &local_78;
    StreamSepMaker::operator<<(pSVar5,ss,(char (*) [40])"    end_m1 = buf->data + buf->used - 1;");
  }
  else {
    pSVar5 = &local_c0;
    StreamSepMaker::operator<<
              (pSVar5,ss,
               (char (*) [68])"    end_m1 = buf->data + ( end > buf->used ? buf->used : end ) - 1;")
    ;
  }
  StreamSep::~StreamSep(pSVar5);
  StreamSepMaker::operator<<(&local_5d0,ss,(char (*) [2])0x178092);
  StreamSep::~StreamSep(&local_5d0);
  if (this->beg == true) {
    std::__cxx11::string::resize((ulong)&ss->beg);
    StreamSepMaker::operator<<(&local_618,ss,(char (*) [2])0x178092);
    StreamSep::~StreamSep(&local_618);
  }
  std::__cxx11::string::~string((string *)&v);
LAB_0015b39b:
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionSkipBytes::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->need_buf() ) {
        unsigned cont_label = ++cpp_emitter->nb_cont_label;

        // cpp_emitter->need_loc_var(  );
        std::string v = var;
        if ( cpp_emitter->variables.count( v ) )
            v = "HPIPE_DATA." + v;
        if ( beg ) {
            ss << "if ( " << v << " ) {";
            ss.beg += "    ";
            ss << "size_t __l = " << v << " - 1;";
            v = "__l";
        }
        // we can stay in the same buffer
        ss << "if ( data + " << v << " <= end_m1 ) {";
        ss << "    data += " << v << ";";
        ss << "} else {";
        // skip data in current buf
        cpp_emitter->preliminaries.push_back_unique( "#ifndef HPIPE_SIZE_T\n#define HPIPE_SIZE_T size_t\n#endif // HPIPE_SIZE_T\n" );
        cpp_emitter->add_variable( "__bytes_to_skip", "HPIPE_SIZE_T" );
        if ( beg && next.size() >= 2 )
            es << "if ( ! buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "    HPIPE_DATA.__bytes_to_skip = " << v << " - ( buf->data + buf->used - data );";
        ss << "  t_" << cont_label << ":";
        ss << "    if ( ! buf->next ) {";
        if ( cpp_emitter->interruptible() ) {
            ss << "        if ( last_buf )";
            ss << "            goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
            if ( need_buf_next() ) {
                cpp_emitter->add_variable( "pending_buf", "HPIPE_BUFF_T *" );
                ss << "        HPIPE_DATA.pending_buf = buf;";
                if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_BUFFER ) {
                    if ( need_buf_next() == 1 )
                        ss << "        HPIPE_BUFF_T__INC_REF( buf );";
                    else
                        ss << "        HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() << " );";
                }
                ss << "        HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
            } else
                ss << "        HPIPE_DATA.inp_cont = &&c_" << cont_label << ";";
            ss << "        return RET_CONT;";
            if ( need_buf_next() ) {
                // e_... (come back code)
                ss << "      e_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"e_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
                ss << "        HPIPE_DATA.pending_buf->next = buf;";
                ss << "        HPIPE_DATA.pending_buf = buf;";
                ss << "        goto c_" << cont_label << ";";
            }
        } else
            ss << "        goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "    }";
        if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_CB_STRING_PTR )
            ss << "    end -= buf->used; buf = buf->next;";
        else if ( need_buf_next() > 1 )
            ss << "    HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() - 1 << " ); buf = buf->next;";
        else if ( need_buf_next() == 1 )
            ss << "    buf = buf->next;";
        else
            ss << "    HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old );";
        ss << "  c_" << cont_label << ":";
        ss << "    if ( HPIPE_DATA.__bytes_to_skip >= buf->used ) {";
        ss << "        HPIPE_DATA.__bytes_to_skip -= buf->used;";
        ss << "        goto t_" << cont_label << ";";
        ss << "    }";
        ss << "    data = buf->data + HPIPE_DATA.__bytes_to_skip;";
        if ( cpp_emitter->interruptible() )
            ss << "    end_m1 = buf->data + buf->used - 1;";
        else
            ss << "    end_m1 = buf->data + ( end > buf->used ? buf->used : end ) - 1;";
        ss << "}";
        if ( beg ) {
            ss.beg.resize( ss.beg.size() - 4 );
            ss << "}";
        }
    } else if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( beg ) {
            ss << "if ( " << var << " ) {";
            ss.beg += "    ";
        }
        ss << "for( size_t n = ( " << var << ( beg ? " ) - 1" : " )" ) << "; n--; ++data )";
        ss << "    if ( *data == " << cpp_emitter->stop_char << " )";
        ss << "        goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "if ( *data == " << cpp_emitter->stop_char << " )";
        ss << "    goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( beg ) {
            ss.beg.resize( ss.beg.size() - 4 );
            ss << "}";
        }
    } else {
        if ( next.size() > 1 )
            ss << "if ( data + ( " << var << ( beg ? " ) - 1" : " )" ) << " > end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "data += ( " << var << ( beg ? " ) - 1" : " )" ) << ";";
    }
    write_trans( ss, cpp_emitter );
}